

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barcode.h
# Opt level: O0

void __thiscall
barcode_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
::remaining_homology_is_trivial
          (barcode_output_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
           *this)

{
  ostream *poVar1;
  long in_RDI;
  
  poVar1 = (ostream *)
           std::ostream::operator<<((void *)(in_RDI + 8),std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"The remaining homology groups are trivial.");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void remaining_homology_is_trivial() {
		file_output_t<Complex>::outstream << std::endl << "The remaining homology groups are trivial." << std::endl;
	}